

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<QString,_QVariant> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::findNode<QString>
          (Data<QHashPrivate::Node<QString,_QVariant>_> *this,QString *key)

{
  size_t hash;
  ulong uVar1;
  Node<QString,_QVariant> *pNVar2;
  QStringView QVar3;
  Bucket BVar4;
  
  QVar3.m_data = (key->d).ptr;
  QVar3.m_size = (key->d).size;
  hash = qHash(QVar3,this->seed);
  BVar4 = findBucketWithHash<QString>(this,key,hash);
  uVar1 = (ulong)(BVar4.span)->offsets[BVar4.index];
  if (uVar1 == 0xff) {
    pNVar2 = (Node<QString,_QVariant> *)0x0;
  }
  else {
    pNVar2 = (Node<QString,_QVariant> *)((BVar4.span)->entries + uVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }